

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

double matd_vec_dist(matd_t *a,matd_t *b)

{
  int iVar1;
  double dVar2;
  int lena;
  matd_t *b_local;
  matd_t *a_local;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x358,"double matd_vec_dist(const matd_t *, const matd_t *)");
  }
  if (b != (matd_t *)0x0) {
    iVar1 = matd_is_vector(a);
    if (iVar1 != 0) {
      iVar1 = matd_is_vector(b);
      if (iVar1 != 0) {
        if (a->nrows * a->ncols == b->nrows * b->ncols) {
          dVar2 = matd_vec_dist_n(a,b,a->nrows * a->ncols);
          return dVar2;
        }
        __assert_fail("a->nrows*a->ncols == b->nrows*b->ncols",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                      ,0x35b,"double matd_vec_dist(const matd_t *, const matd_t *)");
      }
    }
    __assert_fail("matd_is_vector(a) && matd_is_vector(b)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x35a,"double matd_vec_dist(const matd_t *, const matd_t *)");
  }
  __assert_fail("b != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x359,"double matd_vec_dist(const matd_t *, const matd_t *)");
}

Assistant:

double matd_vec_dist(const matd_t *a, const matd_t *b)
{
    assert(a != NULL);
    assert(b != NULL);
    assert(matd_is_vector(a) && matd_is_vector(b));
    assert(a->nrows*a->ncols == b->nrows*b->ncols);

    int lena = a->nrows*a->ncols;
    return matd_vec_dist_n(a, b, lena);
}